

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

ssize_t __thiscall TCPConnection::read(TCPConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  undefined4 in_register_00000034;
  uchar *__result;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *pdVar5;
  iterator local_1b8;
  iterator local_198;
  _Self local_178;
  const_iterator local_158;
  iterator local_138;
  const_iterator local_118;
  iterator local_f8;
  _Self local_d8;
  iterator local_b8;
  iterator local_98;
  iterator local_78;
  TCPConnection *local_58;
  size_t read_size;
  undefined4 local_3c;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lck;
  size_t size_local;
  uint8_t *buf_local;
  TCPConnection *this_local;
  
  __result = (uchar *)CONCAT44(in_register_00000034,__fd);
  lck._8_8_ = __buf;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->_read_m);
  bVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->_recv_buf);
  if (bVar2) {
    this_local = (TCPConnection *)0x0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"try to read");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lck._8_8_);
    poVar3 = std::operator<<(poVar3,"from server");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Available size is ");
    sVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_recv_buf);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    uVar1 = lck._8_8_;
    sVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_recv_buf);
    if (sVar4 < (ulong)uVar1) {
      pdVar5 = &this->_recv_buf;
      local_58 = (TCPConnection *)
                 std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(pdVar5);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_78,pdVar5);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end(&local_98,pdVar5);
      std::copy<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,unsigned_char*>
                (&local_78,&local_98,__result);
      hexDump((char *)0x0,__result,(int)local_58);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_recv_buf);
      if (this->state_ == ESTABLISHED) {
        this->_buffer_ready = false;
        this->poll_flags_ = this->poll_flags_ & 0xfffe;
      }
      this_local = local_58;
    }
    else {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_b8,&this->_recv_buf);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_f8,&this->_recv_buf);
      std::operator+(&local_d8,&local_f8,lck._8_8_);
      std::copy<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,unsigned_char*>
                (&local_b8,&local_d8,__result);
      pdVar5 = &this->_recv_buf;
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_138,pdVar5);
      std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
      _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                 &local_118,&local_138);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_198,pdVar5);
      std::operator+(&local_178,&local_198,lck._8_8_);
      std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
      _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                 &local_158,&local_178);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&local_1b8,pdVar5,&local_118,&local_158);
      hexDump((char *)0x0,__result,lck._8_4_);
      this_local = (TCPConnection *)lck._8_8_;
    }
  }
  local_3c = 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return (ssize_t)this_local;
}

Assistant:

ssize_t TCPConnection::read(uint8_t *buf, size_t size) {
    std::unique_lock lck(_read_m);
//    std::cout << "before wait" << std::endl;
//    _cv.wait(lck, [&] { return _buffer_ready; });
//    std::cout << "after wait" << std::endl;
    if (_recv_buf.empty()) {
        return 0;
    }
    std::cout << "try to read" << size << "from server" << std::endl;
    std::cout << "Available size is " << _recv_buf.size() << std::endl;
    if (size > _recv_buf.size()) {
        size_t read_size = _recv_buf.size();
        std::copy(_recv_buf.begin(), _recv_buf.end(), buf);
        hexDump(nullptr, buf, read_size);
        _recv_buf.clear();
        if (state_ == State::ESTABLISHED) {
            _buffer_ready = false;
            poll_flags_ &= ~POLLIN;
        }
        return read_size;
    } else {
        std::copy(_recv_buf.begin(), _recv_buf.begin() + size, buf);
        _recv_buf.erase(_recv_buf.begin(), _recv_buf.begin() + size);
        hexDump(nullptr, buf, size);
        return size;
    }
}